

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::StartCall(SQVM *this,SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,
               bool tailcall)

{
  SQGenerator *pSVar1;
  byte bVar2;
  bool bVar3;
  SQArray *pSVar4;
  SQVM *this_00;
  SQGenerator *in_RCX;
  long lVar5;
  SQInt32 in_EDX;
  long in_RSI;
  SQVM *in_RDI;
  SQVM *in_R8;
  byte in_R9B;
  SQObjectPtr temp;
  SQGenerator *gen;
  SQFunctionProto *f;
  SQInteger n_1;
  SQInteger diff;
  SQInteger ndef;
  SQInteger n;
  SQInteger pbase;
  SQArray *arr;
  SQInteger nvargs;
  SQInteger nargs;
  SQInteger newtop;
  SQInteger paramssize;
  SQFunctionProto *func;
  SQClosure *in_stack_ffffffffffffff28;
  SQSharedState *in_stack_ffffffffffffff30;
  SQObjectPtr *in_stack_ffffffffffffff40;
  SQObjectPtr *in_stack_ffffffffffffff48;
  SQInteger in_stack_ffffffffffffff50;
  SQObjectValue in_stack_ffffffffffffff58;
  long in_stack_ffffffffffffff70;
  undefined1 tailcall_00;
  long in_stack_ffffffffffffff78;
  long in_stack_ffffffffffffff80;
  SQVM *in_stack_ffffffffffffff88;
  undefined1 *local_70;
  long forcedline;
  undefined7 in_stack_ffffffffffffffc8;
  bool local_1;
  
  bVar2 = in_R9B & 1;
  forcedline = *(long *)(in_RSI + 0x48);
  pSVar1 = *(SQGenerator **)(forcedline + 0x98);
  if (*(long *)(forcedline + 0x60) == 0) {
    if (pSVar1 != in_RCX) {
      in_stack_ffffffffffffff80 = *(long *)(forcedline + 200);
      if (((in_stack_ffffffffffffff80 == 0) || ((long)pSVar1 <= (long)in_RCX)) ||
         (in_stack_ffffffffffffff78 = (long)pSVar1 - (long)in_RCX,
         in_stack_ffffffffffffff80 < in_stack_ffffffffffffff78)) {
        Raise_Error(in_RDI,"wrong number of parameters (%d passed, %d required)",
                    (ulong)in_RCX & 0xffffffff,(ulong)pSVar1 & 0xffffffff);
        return false;
      }
      for (in_stack_ffffffffffffff70 = in_stack_ffffffffffffff80 - in_stack_ffffffffffffff78;
          in_stack_ffffffffffffff70 < in_stack_ffffffffffffff80;
          in_stack_ffffffffffffff70 = in_stack_ffffffffffffff70 + 1) {
        ::SQObjectPtr::operator=(in_stack_ffffffffffffff40,(SQObjectPtr *)in_RDI);
      }
    }
    tailcall_00 = (undefined1)((ulong)in_stack_ffffffffffffff70 >> 0x38);
  }
  else {
    local_70 = &pSVar1[-1].field_0xbf;
    if ((long)in_RCX < (long)local_70) {
      Raise_Error(in_RDI,"wrong number of parameters (%d passed, at least %d required)",
                  (ulong)in_RCX & 0xffffffff,(ulong)local_70 & 0xffffffff);
      return false;
    }
    lVar5 = (long)in_RCX - (long)local_70;
    pSVar4 = SQArray::Create(in_stack_ffffffffffffff30,(SQInteger)in_stack_ffffffffffffff28);
    local_70 = local_70 + (long)&in_R8->super_SQCollectable;
    for (in_stack_ffffffffffffff88 = (SQVM *)0x0;
        tailcall_00 = (undefined1)((ulong)in_stack_ffffffffffffff70 >> 0x38),
        (long)in_stack_ffffffffffffff88 < lVar5;
        in_stack_ffffffffffffff88 =
             (SQVM *)((long)&(in_stack_ffffffffffffff88->super_SQCollectable).super_SQRefCounted.
                             _vptr_SQRefCounted + 1)) {
      in_stack_ffffffffffffff30 = (SQSharedState *)((in_RDI->_stack)._vals + (long)local_70);
      sqvector<SQObjectPtr>::operator[]
                (&pSVar4->_values,(SQUnsignedInteger)in_stack_ffffffffffffff88);
      ::SQObjectPtr::operator=(in_stack_ffffffffffffff40,(SQObjectPtr *)in_RDI);
      ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffff30);
      local_70 = local_70 + 1;
    }
    ::SQObjectPtr::operator=(in_stack_ffffffffffffff40,(SQArray *)in_RDI);
  }
  if (*(long *)(in_RSI + 0x30) != 0) {
    ::SQObjectPtr::operator=(in_stack_ffffffffffffff40,(SQObject *)in_RDI);
  }
  bVar3 = EnterFrame(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     (bool)tailcall_00);
  if (bVar3) {
    ::SQObjectPtr::operator=(in_stack_ffffffffffffff40,(SQClosure *)in_RDI);
    in_RDI->ci->_literals = *(SQObjectPtr **)(forcedline + 0x90);
    in_RDI->ci->_ip = (SQInstruction *)(forcedline + 0xe0);
    in_RDI->ci->_target = in_EDX;
    if ((in_RDI->_debughook & 1U) != 0) {
      CallDebugHook(in_R8,CONCAT17(bVar2,in_stack_ffffffffffffffc8),forcedline);
    }
    if ((*(byte *)(*(long *)(in_RSI + 0x48) + 0x58) & 1) != 0) {
      this_00 = (SQVM *)SQGenerator::Create(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      bVar3 = SQGenerator::Yield(in_RCX,in_R8,CONCAT17(bVar2,in_stack_ffffffffffffffc8));
      if (!bVar3) {
        return false;
      }
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff50);
      Return(this_00,in_stack_ffffffffffffff58.nInteger,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
      ::SQObjectPtr::operator=(in_stack_ffffffffffffff40,(SQGenerator *)in_RDI);
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff30);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQVM::StartCall(SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,bool tailcall)
{
    SQFunctionProto *func = closure->_function;

    SQInteger paramssize = func->_nparameters;
    const SQInteger newtop = stackbase + func->_stacksize;
    SQInteger nargs = args;
    if(func->_varparams)
    {
        paramssize--;
        if (nargs < paramssize) {
            Raise_Error(_SC("wrong number of parameters (%d passed, at least %d required)"),
              (int)nargs, (int)paramssize);
            return false;
        }

        //dumpstack(stackbase);
        SQInteger nvargs = nargs - paramssize;
        SQArray *arr = SQArray::Create(_ss(this),nvargs);
        SQInteger pbase = stackbase+paramssize;
        for(SQInteger n = 0; n < nvargs; n++) {
            arr->_values[n] = _stack._vals[pbase];
            _stack._vals[pbase].Null();
            pbase++;

        }
        _stack._vals[stackbase+paramssize] = arr;
        //dumpstack(stackbase);
    }
    else if (paramssize != nargs) {
        SQInteger ndef = func->_ndefaultparams;
        SQInteger diff;
        if(ndef && nargs < paramssize && (diff = paramssize - nargs) <= ndef) {
            for(SQInteger n = ndef - diff; n < ndef; n++) {
                _stack._vals[stackbase + (nargs++)] = closure->_defaultparams[n];
            }
        }
        else {
            Raise_Error(_SC("wrong number of parameters (%d passed, %d required)"),
              (int)nargs, (int)paramssize);
            return false;
        }
    }

    if(closure->_env) {
        _stack._vals[stackbase] = closure->_env->_obj;
    }

    if(!EnterFrame(stackbase, newtop, tailcall)) return false;

    ci->_closure  = closure;
    ci->_literals = func->_literals;
    ci->_ip       = func->_instructions;
    ci->_target   = (SQInt32)target;

    if (_debughook) {
        CallDebugHook(_SC('c'));
    }

    if (closure->_function->_bgenerator) {
        SQFunctionProto *f = closure->_function;
        SQGenerator *gen = SQGenerator::Create(_ss(this), closure);
        if(!gen->Yield(this,f->_stacksize))
            return false;
        SQObjectPtr temp;
        Return(1, target, temp);
        STK(target) = gen;
    }


    return true;
}